

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_insert_pause(JPCommonLabel *label)

{
  int iVar1;
  _JPCommonLabelPhoneme *p_Var2;
  JPCommonLabelPhoneme *in_RDI;
  char *in_stack_00000008;
  JPCommonLabelPhoneme *in_stack_00000010;
  
  if (*(int *)&in_RDI[3].phoneme == 1) {
    if (in_RDI[2].up == (_JPCommonLabelMora *)0x0) {
      fprintf(_stderr,
              "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: First mora should not be short pause.\n"
             );
    }
    else {
      iVar1 = strcmp((in_RDI[2].up)->mora,"pau");
      if (iVar1 == 0) {
        fprintf(_stderr,
                "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: Short pause should not be chained.\n"
               );
        return;
      }
      p_Var2 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
      (in_RDI[2].up)->tail = p_Var2;
      JPCommonLabelPhoneme_initialize
                (in_stack_00000010,in_stack_00000008,(JPCommonLabelPhoneme *)label,in_RDI,
                 (JPCommonLabelMora *)0x206e3e);
      in_RDI[2].up = (_JPCommonLabelMora *)(in_RDI[2].up)->tail;
    }
    *(undefined4 *)&in_RDI[3].phoneme = 0;
  }
  return;
}

Assistant:

static void JPCommonLabel_insert_pause(JPCommonLabel * label)
{
   /* insert short pause */
   if (label->short_pause_flag == 1) {
      if (label->phoneme_tail != NULL) {
         if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0) {
            fprintf(stderr,
                    "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: Short pause should not be chained.\n");
            return;
         }
         label->phoneme_tail->next =
             (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
         JPCommonLabelPhoneme_initialize(label->phoneme_tail->next, JPCOMMON_PHONEME_SHORT_PAUSE,
                                         label->phoneme_tail, NULL, NULL);
         label->phoneme_tail = label->phoneme_tail->next;
      } else {
         fprintf(stderr,
                 "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: First mora should not be short pause.\n");
      }
      label->short_pause_flag = 0;
   }
}